

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O1

int big_block_write(BigBlock *bb,BigBlockPtr *ptr,BigArray *array)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  byte *buf;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  int *piVar8;
  char *pcVar9;
  ulong __size;
  uint uVar10;
  ulong __n;
  long lVar11;
  byte *pbVar12;
  uint uVar13;
  size_t dims [2];
  BigArray chunk_array;
  BigArrayIter array_iter;
  BigArrayIter chunk_iter;
  FILE *local_4b8;
  ulong local_498;
  long local_490;
  BigArray local_480;
  BigArrayIter local_260;
  BigArrayIter local_148;
  
  if (array->size == 0) {
    return 0;
  }
  bb->dirty = 1;
  sVar3 = CHUNK_BYTES;
  buf = (byte *)malloc(CHUNK_BYTES);
  uVar10 = bb->nmemb;
  local_490 = (long)(int)uVar10;
  uVar13 = 1;
  if (1 < uVar10) {
    uVar13 = uVar10;
  }
  _dtype_normalize((char *)&local_480,bb->dtype);
  iVar4 = atoi((char *)((long)&local_480.ndim + 2));
  __size = (ulong)(int)(iVar4 * uVar13);
  uVar5 = sVar3 / __size;
  memset(&local_480,0,0x220);
  local_498 = uVar5;
  if (buf == (byte *)0x0) {
    _big_file_raise("not enough memory for chunkbuf of size %d bytes",
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x391,sVar3);
  }
  else {
    big_array_init(&local_480,buf,bb->dtype,2,&local_498,(ptrdiff_t *)0x0);
    big_array_iter_init(&local_260,array);
    uVar6 = array->size / (ulong)(long)(int)uVar13;
    if (bb->size < bb->foffset[ptr->fileid] + uVar6 + ptr->roffset) {
      _big_file_raise("Writing beyond the block `%s` at (%d:%td)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x39c,bb->basename,(long)ptr->fileid,ptr->roffset * __size);
    }
    else {
      do {
        if ((long)uVar6 < 1) {
LAB_00106c70:
          free(buf);
          return 0;
        }
        if (bb->size <= bb->foffset[ptr->fileid] + ptr->roffset) goto LAB_00106c70;
        __n = bb->fsize[ptr->fileid] - ptr->roffset;
        if (uVar5 < __n) {
          __n = uVar5;
        }
        if (uVar6 <= __n) {
          __n = uVar6;
        }
        big_array_iter_init(&local_148,&local_480);
        iVar4 = _dtype_convert(&local_148,&local_260,(long)bb->nmemb * __n);
        if (iVar4 == 0) {
          uVar10 = bb->fchecksum[ptr->fileid];
          pbVar12 = buf;
          for (lVar11 = __n * __size; lVar11 != 0; lVar11 = lVar11 + -1) {
            bVar1 = *pbVar12;
            pbVar12 = pbVar12 + 1;
            uVar10 = uVar10 + bVar1;
          }
          bb->fchecksum[ptr->fileid] = uVar10;
          local_4b8 = (FILE *)_big_file_open_a_file(bb->basename,ptr->fileid,"r+",1);
          if (local_4b8 == (FILE *)0x0) {
            _big_file_raise((char *)0x0,
                            "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                            ,0x3b4);
            uVar10 = 7;
            local_4b8 = (FILE *)0x0;
          }
          else {
            iVar4 = fseek(local_4b8,ptr->roffset * __size,0);
            if (iVar4 < 0) {
              pcVar2 = bb->basename;
              uVar10 = ptr->fileid;
              lVar11 = ptr->roffset;
              piVar8 = __errno_location();
              pcVar9 = strerror(*piVar8);
              _big_file_raise("Failed to seek in block `%s\' at (%d:%td) (%s)",
                              "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                              ,0x3b8,pcVar2,(ulong)uVar10,lVar11 * __size,pcVar9);
              uVar10 = 8;
            }
            else {
              sVar7 = fwrite(buf,__size,__n,local_4b8);
              if (__n == sVar7) {
                fclose(local_4b8);
                uVar6 = uVar6 - __n;
                iVar4 = big_block_seek(bb,ptr,__n + bb->foffset[ptr->fileid] + ptr->roffset);
                if (iVar4 == 0) {
                  uVar10 = 0;
                }
                else {
                  _big_file_raise((char *)0x0,
                                  "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                                  ,0x3c1);
                  uVar10 = 10;
                }
              }
              else {
                pcVar2 = bb->basename;
                uVar10 = ptr->fileid;
                lVar11 = ptr->roffset;
                piVar8 = __errno_location();
                pcVar9 = strerror(*piVar8);
                _big_file_raise("Failed to write in block `%s\' at (%d:%td) (%s)",
                                "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                                ,0x3bc,pcVar2,(ulong)uVar10,lVar11 * __size,pcVar9);
                uVar10 = 9;
              }
            }
          }
        }
        else {
          _big_file_raise((char *)0x0,
                          "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                          ,0x3ad);
          uVar10 = 6;
        }
      } while (uVar10 == 0);
      if (10 < uVar10) {
        return uVar10;
      }
      if ((0x4c0U >> uVar10 & 1) == 0) {
        if ((0x300U >> uVar10 & 1) == 0) {
          return uVar10;
        }
        fclose(local_4b8);
      }
    }
    free(buf);
  }
  return -1;
}

Assistant:

int
big_block_write(BigBlock * bb, BigBlockPtr * ptr, BigArray * array)
{
    if(array->size == 0) return 0;
    /* the file header is modified */
    bb->dirty = 1;
    char * chunkbuf = malloc(CHUNK_BYTES);
    int nmemb = bb->nmemb ? bb->nmemb : 1;
    int felsize = big_file_dtype_itemsize(bb->dtype) * nmemb;
    size_t CHUNK_SIZE = CHUNK_BYTES / felsize;

    BigArray chunk_array = {0};
    size_t dims[2];
    dims[0] = CHUNK_SIZE;
    dims[1] = bb->nmemb;

    BigArrayIter chunk_iter;
    BigArrayIter array_iter;
    ptrdiff_t towrite = 0;
    FILE * fp;

    RAISEIF(chunkbuf == NULL,
            ex_malloc,
            "not enough memory for chunkbuf of size %d bytes", CHUNK_BYTES);

    big_array_init(&chunk_array, chunkbuf, bb->dtype, 2, dims, NULL);
    big_array_iter_init(&array_iter, array);

    towrite = array->size / nmemb;

    ptrdiff_t abs = bb->foffset[ptr->fileid] + ptr->roffset + towrite;
    RAISEIF(abs > bb->size,
                ex_eof,
                "Writing beyond the block `%s` at (%d:%td)",
                bb->basename, ptr->fileid, ptr->roffset * felsize);

    while(towrite > 0 && ! big_block_eof(bb, ptr)) {
        size_t chunk_size = CHUNK_SIZE;
        /* remaining items in the file */
        if(chunk_size > bb->fsize[ptr->fileid] - ptr->roffset) {
            chunk_size = bb->fsize[ptr->fileid] - ptr->roffset;
        }
        /* remaining items to read */
        if(chunk_size > towrite) {
            chunk_size = towrite;
        }
        /* write from the beginning of chunk */
        big_array_iter_init(&chunk_iter, &chunk_array);

        /* now translate the data to format in the file*/
        RAISEIF(0 != _dtype_convert(&chunk_iter, &array_iter, chunk_size * bb->nmemb),
            ex_convert, NULL);

        sysvsum(&bb->fchecksum[ptr->fileid], chunkbuf, chunk_size * felsize);

        fp = _big_file_open_a_file(bb->basename, ptr->fileid, "r+", 1);
        RAISEIF(fp == NULL,
                ex_open,
                NULL);
        RAISEIF(0 > fseek(fp, ptr->roffset * felsize, SEEK_SET),
                ex_seek,
                "Failed to seek in block `%s' at (%d:%td) (%s)", 
                bb->basename, ptr->fileid, ptr->roffset * felsize, strerror(errno));
        RAISEIF(chunk_size != fwrite(chunkbuf, felsize, chunk_size, fp),
                ex_write,
                "Failed to write in block `%s' at (%d:%td) (%s)",
                bb->basename, ptr->fileid, ptr->roffset * felsize, strerror(errno));
        fclose(fp);

        towrite -= chunk_size;
        RAISEIF(0 != big_block_seek_rel(bb, ptr, chunk_size),
                ex_blockseek, NULL);
    }
    free(chunkbuf);
    return 0;
ex_write:
ex_seek:
    fclose(fp);
ex_convert:
ex_open:
ex_blockseek:
ex_eof:
    free(chunkbuf);
ex_malloc:
    return -1;
}